

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitClass(ParseNodeClass *pnodeClass,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ParseNode *this;
  Symbol *pSVar1;
  code *pcVar2;
  RegSlot RVar3;
  bool bVar4;
  RegSlot RVar5;
  undefined4 *puVar6;
  ByteCodeWriter *pBVar7;
  ParseNodeBin *pPVar8;
  ParseNodeFnc *pPVar9;
  RegSlot local_9c;
  RegSlot local_8c;
  RegSlot local_78;
  RegSlot local_74;
  Symbol *sym_1;
  Symbol *sym;
  ParseNodeFnc *pnodeMemberFnc;
  ParseNode *pnodeMember;
  ParseNode *pnodeMembers;
  ByteCodeLabel BStack_40;
  bool isObjectEmpty;
  uint cacheId;
  ByteCodeLabel labelParentsFound;
  ByteCodeLabel haveConstructor;
  ByteCodeLabel needProto;
  RegSlot protoParentLoc;
  RegSlot ctorParentLoc;
  RegSlot tmpFrameDisplayLoc;
  RegSlot frameDisplayLoc;
  RegSlot protoLoc;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeClass *pnodeClass_local;
  
  _frameDisplayLoc = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeClass;
  FuncInfo::AcquireLoc(funcInfo,&pnodeClass->super_ParseNode);
  if (byteCodeGenerator_local->currentTopStatement == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2a7a,"(pnodeClass->pnodeConstructor)","pnodeClass->pnodeConstructor");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  byteCodeGenerator_local->currentTopStatement->location =
       *(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4);
  tmpFrameDisplayLoc = FuncInfo::AcquireTmpRegister(_frameDisplayLoc);
  BeginEmitBlock(byteCodeGenerator_local->currentBlock,(ByteCodeGenerator *)funcInfo_local,
                 _frameDisplayLoc);
  if (_frameDisplayLoc->frameDisplayRegister == 0xffffffff) {
    local_74 = FuncInfo::GetEnvRegister(_frameDisplayLoc);
  }
  else {
    local_74 = _frameDisplayLoc->frameDisplayRegister;
  }
  ctorParentLoc = local_74;
  protoParentLoc = FuncInfo::AcquireTmpRegister(_frameDisplayLoc);
  ctorParentLoc =
       ByteCodeGenerator::PrependLocalScopes
                 ((ByteCodeGenerator *)funcInfo_local,ctorParentLoc,protoParentLoc,_frameDisplayLoc)
  ;
  if (ctorParentLoc != protoParentLoc) {
    FuncInfo::ReleaseTmpRegister(_frameDisplayLoc,protoParentLoc);
  }
  RVar3 = ctorParentLoc;
  if (byteCodeGenerator_local->globalScope == (Scope *)0x0) {
    if ((ctorParentLoc == _frameDisplayLoc->frameDisplayRegister) ||
       (RVar5 = FuncInfo::GetEnvRegister(_frameDisplayLoc), RVar3 == RVar5)) {
      pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Reg2U
                (pBVar7,InitBaseClass,*(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4),
                 tmpFrameDisplayLoc,byteCodeGenerator_local->currentTopStatement[7].location);
    }
    else {
      pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Reg3U
                (pBVar7,InitInnerBaseClass,*(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4),
                 tmpFrameDisplayLoc,ctorParentLoc,
                 byteCodeGenerator_local->currentTopStatement[7].location);
    }
  }
  else {
    Emit((ParseNode *)byteCodeGenerator_local->globalScope,(ByteCodeGenerator *)funcInfo_local,
         _frameDisplayLoc,0,false,false);
    ByteCodeGenerator::StartStatement
              ((ByteCodeGenerator *)funcInfo_local,(ParseNode *)byteCodeGenerator_local->globalScope
              );
    bVar4 = FuncInfo::IsTmpReg(_frameDisplayLoc,
                               *(RegSlot *)
                                ((long)&byteCodeGenerator_local->globalScope->scopeInfo + 4));
    if (bVar4) {
      local_78 = *(RegSlot *)((long)&byteCodeGenerator_local->globalScope->scopeInfo + 4);
    }
    else {
      local_78 = FuncInfo::AcquireTmpRegister(_frameDisplayLoc);
    }
    needProto = local_78;
    haveConstructor = FuncInfo::AcquireTmpRegister(_frameDisplayLoc);
    if (*(int *)((long)&byteCodeGenerator_local->globalScope->scopeInfo + 4) != needProto) {
      pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Reg2
                (pBVar7,Ld_A_ReuseLoc,needProto,
                 *(RegSlot *)((long)&byteCodeGenerator_local->globalScope->scopeInfo + 4));
    }
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    labelParentsFound = Js::ByteCodeWriter::DefineLabel(pBVar7);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    cacheId = Js::ByteCodeWriter::DefineLabel(pBVar7);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    BStack_40 = Js::ByteCodeWriter::DefineLabel(pBVar7);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::BrReg1(pBVar7,BrOnNotNullObj_A,labelParentsFound,needProto);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::Reg1(pBVar7,LdC_A_Null,haveConstructor);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::Reg1(pBVar7,LdBaseFncProto,needProto);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::Br(pBVar7,BStack_40);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::MarkLabel(pBVar7,labelParentsFound);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::BrReg1(pBVar7,BrOnConstructor_A,cacheId,needProto);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::W1(pBVar7,RuntimeTypeError,0x140b);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::MarkLabel(pBVar7,cacheId);
    pnodeMembers._4_4_ =
         FuncInfo::FindOrAddInlineCacheId(_frameDisplayLoc,needProto,0x124,false,false);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::PatchableProperty
              (pBVar7,LdFld_ReuseLoc,haveConstructor,needProto,pnodeMembers._4_4_,false,true);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::BrReg1(pBVar7,BrOnObjectOrNull_A,BStack_40,haveConstructor);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::W1(pBVar7,RuntimeTypeError,0x139f);
    pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::MarkLabel(pBVar7,BStack_40);
    RVar3 = ctorParentLoc;
    if ((ctorParentLoc == _frameDisplayLoc->frameDisplayRegister) ||
       (RVar5 = FuncInfo::GetEnvRegister(_frameDisplayLoc), RVar3 == RVar5)) {
      pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Reg4U
                (pBVar7,InitClass,*(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4),
                 tmpFrameDisplayLoc,needProto,haveConstructor,
                 byteCodeGenerator_local->currentTopStatement[7].location);
    }
    else {
      pBVar7 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Reg5U
                (pBVar7,InitInnerClass,*(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4),
                 tmpFrameDisplayLoc,needProto,haveConstructor,ctorParentLoc,
                 byteCodeGenerator_local->currentTopStatement[7].location);
    }
    FuncInfo::ReleaseTmpRegister(_frameDisplayLoc,haveConstructor);
    FuncInfo::ReleaseTmpRegister(_frameDisplayLoc,needProto);
    ByteCodeGenerator::EndStatement
              ((ByteCodeGenerator *)funcInfo_local,(ParseNode *)byteCodeGenerator_local->globalScope
              );
  }
  FuncInfo::ReleaseTmpRegister(_frameDisplayLoc,ctorParentLoc);
  pnodeMembers._3_1_ = 1;
  pnodeMember = (ParseNode *)byteCodeGenerator_local->currentScope;
  if ((Scope *)pnodeMember != (Scope *)0x0) {
    while (pnodeMember->nop == knopList) {
      pPVar8 = ParseNode::AsParseNodeBin(pnodeMember);
      this = pPVar8->pnode1;
      pPVar8 = ParseNode::AsParseNodeBin(this);
      pPVar9 = ParseNode::AsParseNodeFnc(pPVar8->pnode2);
      bVar4 = ParseNodeFnc::IsStaticMember(pPVar9);
      if (bVar4) {
        local_8c = *(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4);
      }
      else {
        local_8c = tmpFrameDisplayLoc;
      }
      EmitMemberNode(this,local_8c,(ByteCodeGenerator *)funcInfo_local,_frameDisplayLoc,
                     (ParseNode *)byteCodeGenerator_local,false,(bool *)((long)&pnodeMembers + 3));
      pPVar8 = ParseNode::AsParseNodeBin(pnodeMember);
      pnodeMember = pPVar8->pnode2;
    }
    pPVar8 = ParseNode::AsParseNodeBin(pnodeMember);
    pPVar9 = ParseNode::AsParseNodeFnc(pPVar8->pnode2);
    bVar4 = ParseNodeFnc::IsStaticMember(pPVar9);
    if (bVar4) {
      local_9c = *(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4);
    }
    else {
      local_9c = tmpFrameDisplayLoc;
    }
    EmitMemberNode(pnodeMember,local_9c,(ByteCodeGenerator *)funcInfo_local,_frameDisplayLoc,
                   (ParseNode *)byteCodeGenerator_local,false,(bool *)((long)&pnodeMembers + 3));
  }
  FuncInfo::ReleaseTmpRegister(_frameDisplayLoc,tmpFrameDisplayLoc);
  if (*(long *)&byteCodeGenerator_local->flags != 0) {
    pSVar1 = *(Symbol **)(*(long *)&byteCodeGenerator_local->flags + 0x20);
    Symbol::SetNeedDeclaration(pSVar1,false);
    ByteCodeGenerator::EmitPropStore
              ((ByteCodeGenerator *)funcInfo_local,
               *(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4),pSVar1,(IdentPtr)0x0,
               _frameDisplayLoc,false,true,false,false);
  }
  EndEmitBlock(byteCodeGenerator_local->currentBlock,(ByteCodeGenerator *)funcInfo_local,
               _frameDisplayLoc);
  if (byteCodeGenerator_local->funcInfoStack !=
      (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    pSVar1 = *(Symbol **)
              &byteCodeGenerator_local->funcInfoStack[1].
               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount;
    Symbol::SetNeedDeclaration(pSVar1,false);
    ByteCodeGenerator::EmitPropStore
              ((ByteCodeGenerator *)funcInfo_local,
               *(RegSlot *)((long)&byteCodeGenerator_local->alloc + 4),pSVar1,(IdentPtr)0x0,
               _frameDisplayLoc,true,false,false,false);
  }
  bVar4 = ParseNodeClass::IsDefaultModuleExport((ParseNodeClass *)byteCodeGenerator_local);
  if (bVar4) {
    ByteCodeGenerator::EmitAssignmentToDefaultModuleExport
              ((ByteCodeGenerator *)funcInfo_local,(ParseNode *)byteCodeGenerator_local,
               _frameDisplayLoc);
  }
  return;
}

Assistant:

void EmitClass(ParseNodeClass * pnodeClass, ByteCodeGenerator * byteCodeGenerator, FuncInfo * funcInfo)
{
    funcInfo->AcquireLoc(pnodeClass);

    Assert(pnodeClass->pnodeConstructor);
    pnodeClass->pnodeConstructor->location = pnodeClass->location;
    Js::RegSlot protoLoc = funcInfo->AcquireTmpRegister();
    BeginEmitBlock(pnodeClass->pnodeBlock, byteCodeGenerator, funcInfo);

    Js::RegSlot frameDisplayLoc = funcInfo->frameDisplayRegister != Js::Constants::NoRegister ? funcInfo->frameDisplayRegister : funcInfo->GetEnvRegister();
    Js::RegSlot tmpFrameDisplayLoc = funcInfo->AcquireTmpRegister();
    frameDisplayLoc = byteCodeGenerator->PrependLocalScopes(frameDisplayLoc, tmpFrameDisplayLoc, funcInfo);
    if (frameDisplayLoc != tmpFrameDisplayLoc)
    {
        funcInfo->ReleaseTmpRegister(tmpFrameDisplayLoc);
    }

    // Extends
    if (pnodeClass->pnodeExtends)
    {
        Emit(pnodeClass->pnodeExtends, byteCodeGenerator, funcInfo, false);

        byteCodeGenerator->StartStatement(pnodeClass->pnodeExtends);

        Js::RegSlot ctorParentLoc = funcInfo->IsTmpReg(pnodeClass->pnodeExtends->location) ? pnodeClass->pnodeExtends->location : funcInfo->AcquireTmpRegister();
        Js::RegSlot protoParentLoc = funcInfo->AcquireTmpRegister();

        if (pnodeClass->pnodeExtends->location != ctorParentLoc)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, ctorParentLoc, pnodeClass->pnodeExtends->location);
        }

        Js::ByteCodeLabel needProto = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel haveConstructor = byteCodeGenerator->Writer()->DefineLabel();
        Js::ByteCodeLabel labelParentsFound = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnNotNullObj_A, needProto, ctorParentLoc);

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdC_A_Null, protoParentLoc);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdBaseFncProto, ctorParentLoc);
        byteCodeGenerator->Writer()->Br(labelParentsFound);

        byteCodeGenerator->Writer()->MarkLabel(needProto);
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnConstructor_A, haveConstructor, ctorParentLoc);
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ErrorOnNew));

        byteCodeGenerator->Writer()->MarkLabel(haveConstructor);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(ctorParentLoc, Js::PropertyIds::prototype, false, false);
        byteCodeGenerator->Writer()->PatchableProperty(Js::OpCode::LdFld_ReuseLoc, protoParentLoc, ctorParentLoc, cacheId);
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrOnObjectOrNull_A, labelParentsFound, protoParentLoc);
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_InvalidPrototype));

        byteCodeGenerator->Writer()->MarkLabel(labelParentsFound);
        if (frameDisplayLoc == funcInfo->frameDisplayRegister || frameDisplayLoc  == funcInfo->GetEnvRegister())
        {
            byteCodeGenerator->Writer()->Reg4U(Js::OpCode::InitClass, pnodeClass->location, protoLoc, ctorParentLoc, protoParentLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->Reg5U(Js::OpCode::InitInnerClass, pnodeClass->location, protoLoc, ctorParentLoc, protoParentLoc, frameDisplayLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }

        funcInfo->ReleaseTmpRegister(protoParentLoc);
        funcInfo->ReleaseTmpRegister(ctorParentLoc);

        byteCodeGenerator->EndStatement(pnodeClass->pnodeExtends);
    }
    else
    {
        if (frameDisplayLoc == funcInfo->frameDisplayRegister || frameDisplayLoc  == funcInfo->GetEnvRegister())
        {
            byteCodeGenerator->Writer()->Reg2U(Js::OpCode::InitBaseClass, pnodeClass->location, protoLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->Reg3U(Js::OpCode::InitInnerBaseClass, pnodeClass->location, protoLoc, frameDisplayLoc, pnodeClass->pnodeConstructor->nestedIndex);
        }
    }

    funcInfo->ReleaseTmpRegister(frameDisplayLoc);

    // Methods
    bool isObjectEmpty = true;
    ParseNode * pnodeMembers = pnodeClass->pnodeMembers;
    ParseNode * pnodeMember;
    ParseNodeFnc * pnodeMemberFnc;
    if (pnodeMembers != nullptr)
    {
        while (pnodeMembers->nop == knopList)
        {
            pnodeMember = pnodeMembers->AsParseNodeBin()->pnode1;
            pnodeMemberFnc = pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc();
            EmitMemberNode(pnodeMember, pnodeMemberFnc->IsStaticMember() ? pnodeClass->location : protoLoc, byteCodeGenerator, funcInfo, pnodeClass, /*useStore*/ false, &isObjectEmpty);
            pnodeMembers = pnodeMembers->AsParseNodeBin()->pnode2;
        }
        pnodeMemberFnc = pnodeMembers->AsParseNodeBin()->pnode2->AsParseNodeFnc();
        EmitMemberNode(pnodeMembers, pnodeMemberFnc->IsStaticMember() ? pnodeClass->location : protoLoc, byteCodeGenerator, funcInfo, pnodeClass, /*useStore*/ false, &isObjectEmpty);
    }

    funcInfo->ReleaseTmpRegister(protoLoc);

    // Emit name binding.
    if (pnodeClass->pnodeName)
    {
        Symbol * sym = pnodeClass->pnodeName->sym;
        sym->SetNeedDeclaration(false);
        byteCodeGenerator->EmitPropStore(pnodeClass->location, sym, nullptr, funcInfo, false, true);
    }

    EndEmitBlock(pnodeClass->pnodeBlock, byteCodeGenerator, funcInfo);

    if (pnodeClass->pnodeDeclName)
    {
        Symbol * sym = pnodeClass->pnodeDeclName->sym;
        sym->SetNeedDeclaration(false);
        byteCodeGenerator->EmitPropStore(pnodeClass->location, sym, nullptr, funcInfo, true, false);
    }

    if (pnodeClass->IsDefaultModuleExport())
    {
        byteCodeGenerator->EmitAssignmentToDefaultModuleExport(pnodeClass, funcInfo);
    }
}